

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readptm.c
# Opt level: O3

int it_ptm_read_pattern(IT_PATTERN *pattern,DUMBFILE *f,uchar *buffer,int length)

{
  byte bVar1;
  uchar uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  IT_ENTRY *entry;
  long lVar6;
  uchar uVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  
  iVar9 = -1;
  if (length != 0) {
    pattern->n_rows = 0;
    pattern->n_entries = 0;
    uVar12 = 0;
    do {
      uVar4 = dumbfile_getc(f);
      uVar10 = uVar12 + 1;
      uVar11 = (ulong)uVar10;
      buffer[(int)uVar12] = (byte)uVar4;
      iVar9 = pattern->n_entries + 1;
      pattern->n_entries = iVar9;
      if ((byte)uVar4 < 0x20) {
        iVar5 = pattern->n_rows + 1;
        pattern->n_rows = iVar5;
        if (iVar5 == 0x40) goto LAB_0070bb1e;
        bVar3 = 0xfffe < (int)uVar12;
        uVar12 = uVar10;
        if (bVar3) {
          return -1;
        }
      }
      else {
        uVar12 = ""[(uVar4 & 0xff) >> 5] + uVar10;
        if (0xffff < (int)uVar12) {
          return -1;
        }
        dumbfile_getnc((char *)(buffer + (int)uVar10),(uint)""[(uVar4 & 0xff) >> 5],f);
      }
      iVar9 = dumbfile_error(f);
      if (iVar9 != 0) {
        return -1;
      }
    } while (((int)uVar12 < length) || (0x3f < pattern->n_rows));
    uVar11 = (ulong)(int)uVar12;
    do {
      if (uVar11 == 0x10000) {
        return -1;
      }
      buffer[uVar11] = '\0';
      uVar11 = uVar11 + 1;
      iVar5 = pattern->n_rows;
      iVar9 = pattern->n_entries + 1;
      pattern->n_entries = iVar9;
      pattern->n_rows = iVar5 + 1;
    } while (iVar5 < 0x3f);
LAB_0070bb1e:
    entry = (IT_ENTRY *)malloc((long)iVar9 * 7);
    pattern->entry = entry;
    iVar9 = -1;
    if (entry != (IT_ENTRY *)0x0) {
      if (0 < (int)uVar11) {
        uVar13 = 0;
        do {
          iVar9 = (int)uVar13;
          lVar6 = (long)iVar9;
          uVar13 = lVar6 + 1;
          bVar1 = buffer[lVar6];
          if (bVar1 == 0) {
            entry->channel = 0xff;
LAB_0070bc10:
            entry = entry + 1;
          }
          else if (0x1f < bVar1) {
            entry->mask = '\0';
            entry->channel = bVar1 & 0x1f;
            if ((bVar1 & 0x20) != 0) {
              uVar2 = buffer[uVar13];
              bVar8 = uVar2 - 1;
              uVar7 = '\x02';
              if (uVar2 == 0xfe || bVar8 < 0x78) {
                if (uVar2 == 0xfe) {
                  bVar8 = 0xfe;
                }
                entry->note = bVar8;
                entry->mask = '\x01';
                uVar7 = '\x03';
              }
              uVar13 = (ulong)(iVar9 + 3);
              uVar2 = buffer[lVar6 + 2];
              entry->instrument = uVar2;
              if (uVar2 != '\0') {
                entry->mask = uVar7;
              }
            }
            if ((bVar1 & 0x40) != 0) {
              iVar9 = (int)uVar13;
              uVar13 = (ulong)(iVar9 + 2);
              _dumb_it_ptm_convert_effect((uint)buffer[iVar9],(uint)buffer[(long)iVar9 + 1],entry);
            }
            if ((char)bVar1 < '\0') {
              iVar9 = (int)uVar13;
              uVar13 = (ulong)(iVar9 + 1);
              bVar1 = buffer[iVar9];
              entry->volpan = bVar1;
              if (bVar1 < 0x41) {
                entry->mask = entry->mask | 4;
              }
            }
            goto LAB_0070bc10;
          }
        } while ((int)uVar13 < (int)uVar11);
      }
      iVar9 = 0;
    }
  }
  return iVar9;
}

Assistant:

static int it_ptm_read_pattern(IT_PATTERN *pattern, DUMBFILE *f, unsigned char *buffer, int length)
{
	int buflen = 0;
	int bufpos = 0;
	int effect, effectvalue;

	IT_ENTRY *entry;

	unsigned char channel;

	if (!length)
		return -1;

	pattern->n_rows = 0;
	pattern->n_entries = 0;

	/* Read in the pattern data, little by little, and work out how many
	 * entries we need room for. Sorry, but this is just so funny...
	 */
	for (;;) {
		unsigned char b = buffer[buflen++] = dumbfile_getc(f);

#if 1
		static const unsigned char used[8] = {0, 2, 2, 4, 1, 3, 3, 5};
		channel = b & 31;
		b >>= 5;
		pattern->n_entries++;
		if (b) {
			if (buflen + used[b] >= 65536) return -1;
            dumbfile_getnc((char *)buffer + buflen, used[b], f);
			buflen += used[b];
		} else {
			/* End of row */
			if (++pattern->n_rows == 64) break;
			if (buflen >= 65536) return -1;
		}
#else
		if (b == 0) {
			/* End of row */
			pattern->n_entries++;
			if (++pattern->n_rows == 64) break;
			if (buflen >= 65536) return -1;
		} else {
			static const unsigned char used[8] = {0, 2, 2, 4, 1, 3, 3, 5};
			channel = b & 31;
			b >>= 5;
			if (b) {
				pattern->n_entries++;
				if (buflen + used[b] >= 65536) return -1;
				dumbfile_getnc(buffer + buflen, used[b], f);
				buflen += used[b];
			}
		}
#endif

		/* We have ensured that buflen < 65536 at this point, so it is safe
		 * to iterate and read at least one more byte without checking.
		 * However, now would be a good time to check for errors reading from
		 * the file.
		 */

		if (dumbfile_error(f))
			return -1;

		/* Great. We ran out of data, but there should be data for more rows.
		 * Fill the rest with null data...
		 */
		if (buflen >= length && pattern->n_rows < 64)
		{
			while (pattern->n_rows < 64)
			{
				if (buflen >= 65536) return -1;
				buffer[buflen++] = 0;
				pattern->n_entries++;
				pattern->n_rows++;
			}
			break;
		}
	}

	pattern->entry = malloc(pattern->n_entries * sizeof(*pattern->entry));

	if (!pattern->entry)
		return -1;

	entry = pattern->entry;

	while (bufpos < buflen) {
		unsigned char b = buffer[bufpos++];

		if (b == 0)
		{
			/* End of row */
			IT_SET_END_ROW(entry);
			entry++;
			continue;
		}

		channel = b & 31;

		if (b & 224) {
			entry->mask = 0;
			entry->channel = channel;

			if (b & 32) {
				unsigned char n = buffer[bufpos++];
				if (n == 254 || (n >= 1 && n <= 120)) {
					if (n == 254)
						entry->note = IT_NOTE_CUT;
					else
						entry->note = n - 1;
					entry->mask |= IT_ENTRY_NOTE;
				}

				entry->instrument = buffer[bufpos++];
				if (entry->instrument)
					entry->mask |= IT_ENTRY_INSTRUMENT;
			}

			if (b & 64) {
				effect = buffer[bufpos++];
				effectvalue = buffer[bufpos++];
				_dumb_it_ptm_convert_effect(effect, effectvalue, entry);
			}

			if (b & 128) {
				entry->volpan = buffer[bufpos++];
				if (entry->volpan <= 64)
					entry->mask |= IT_ENTRY_VOLPAN;
			}

			entry++;
		}
	}

	ASSERT(entry == pattern->entry + pattern->n_entries);

	return 0;
}